

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueueManager.h
# Opt level: O2

void __thiscall QueueManager::QueueManager(QueueManager *this)

{
  ThreadedQueue<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>
  ::ThreadedQueue(&this->for_stdout);
  ThreadedQueue<rapidjson::GenericDocument<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>,_rapidjson::CrtAllocator>_>
  ::ThreadedQueue(&this->for_handlers);
  return;
}

Assistant:

QueueManager() = default;